

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_resolver_test.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::
FeatureResolverPoolTest_CompileDefaultsInvalidValueDeprecatedBeforeIntroducedInherited_Test::
~FeatureResolverPoolTest_CompileDefaultsInvalidValueDeprecatedBeforeIntroducedInherited_Test
          (FeatureResolverPoolTest_CompileDefaultsInvalidValueDeprecatedBeforeIntroducedInherited_Test
           *this)

{
  FeatureResolverPoolTest_CompileDefaultsInvalidValueDeprecatedBeforeIntroducedInherited_Test
  *this_local;
  
  ~FeatureResolverPoolTest_CompileDefaultsInvalidValueDeprecatedBeforeIntroducedInherited_Test(this)
  ;
  operator_delete(this,0x1c0);
  return;
}

Assistant:

TEST_F(FeatureResolverPoolTest,
       CompileDefaultsInvalidValueDeprecatedBeforeIntroducedInherited) {
  const FileDescriptor* file = ParseSchema(R"schema(
    syntax = "proto2";
    package test;
    import "google/protobuf/descriptor.proto";

    extend google.protobuf.FeatureSet {
      optional Foo bar = 9999;
    }
    enum FooValues {
      UNKNOWN = 0;
      VALUE = 1 [feature_support = {
        edition_deprecated: EDITION_2023
        deprecation_warning: "warning"
      }];
    }
    message Foo {
      optional FooValues bool_field = 1 [
        targets = TARGET_TYPE_FIELD,
        feature_support.edition_introduced = EDITION_2024,
        edition_defaults = { edition: EDITION_LEGACY, value: "UNKNOWN" }
      ];
    }
  )schema");
  ASSERT_NE(file, nullptr);

  const FieldDescriptor* ext = file->extension(0);
  EXPECT_THAT(
      FeatureResolver::CompileDefaults(feature_set_, {ext}, EDITION_2023,
                                       EDITION_2023),
      HasError(AllOf(HasSubstr("test.VALUE"),
                     HasSubstr("deprecated before it was introduced"))));
}